

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall OSSLRSA::verifyFinal(OSSLRSA *this,ByteString *signature)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint m_length;
  size_t sVar4;
  uchar *puVar5;
  uchar *puVar6;
  RSA *pRVar7;
  ulong uVar8;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  int result;
  ByteString plain;
  bool rv;
  EVP_MD *hash;
  bool isPSS;
  int type;
  ByteString digest;
  bool bSecondResult;
  bool bFirstResult;
  ByteString secondHash;
  ByteString firstHash;
  Type mechanism;
  OSSLRSAPublicKey *pk;
  ByteString *in_stack_fffffffffffffde8;
  OSSLRSAPublicKey *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  ByteString *in_stack_fffffffffffffe18;
  byte local_10b;
  bool local_c9;
  EVP_MD *local_c8;
  int local_bc;
  undefined1 local_78 [40];
  undefined1 local_50 [44];
  Type local_24;
  PublicKey *local_20;
  byte local_1;
  
  local_20 = in_RDI->currentPublicKey;
  local_24 = in_RDI->currentMechanism;
  bVar1 = AsymmetricAlgorithm::verifyFinal(in_RDI,in_RSI);
  if (bVar1) {
    ByteString::ByteString((ByteString *)0x138cd8);
    ByteString::ByteString((ByteString *)0x138ce5);
    bVar2 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x20))
                      (in_RDI[1]._vptr_AsymmetricAlgorithm,local_50);
    if (in_RDI[1].currentPublicKey == (PublicKey *)0x0) {
      local_10b = 1;
    }
    else {
      iVar3 = (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[4])
                        (in_RDI[1].currentPublicKey,local_78);
      local_10b = (byte)iVar3;
    }
    if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
      (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
    }
    in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
      if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
        (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[1])();
      }
      in_RDI[1].currentPublicKey = (PublicKey *)0x0;
    }
    if (((bVar2 & 1) == 0) || ((local_10b & 1) == 0)) {
      local_1 = 0;
    }
    else {
      operator+(in_stack_fffffffffffffe18,
                (ByteString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_bc = 0;
      bVar1 = false;
      local_c8 = (EVP_MD *)0x0;
      switch(local_24) {
      case RSA_MD5_PKCS:
        local_bc = 4;
        break;
      default:
        break;
      case RSA_SHA1_PKCS:
        local_bc = 0x40;
        break;
      case RSA_SHA224_PKCS:
        local_bc = 0x2a3;
        break;
      case RSA_SHA256_PKCS:
        local_bc = 0x2a0;
        break;
      case RSA_SHA384_PKCS:
        local_bc = 0x2a1;
        break;
      case RSA_SHA512_PKCS:
        local_bc = 0x2a2;
        break;
      case RSA_SHA1_PKCS_PSS:
        bVar1 = true;
        local_c8 = EVP_sha1();
        break;
      case RSA_SHA224_PKCS_PSS:
        bVar1 = true;
        local_c8 = EVP_sha224();
        break;
      case RSA_SHA256_PKCS_PSS:
        bVar1 = true;
        local_c8 = EVP_sha256();
        break;
      case RSA_SHA384_PKCS_PSS:
        bVar1 = true;
        local_c8 = EVP_sha384();
        break;
      case RSA_SHA512_PKCS_PSS:
        bVar1 = true;
        local_c8 = EVP_sha512();
        break;
      case RSA_SSL:
        local_bc = 0x72;
      }
      if (bVar1) {
        ByteString::ByteString((ByteString *)0x13903f);
        (*(local_20->super_Serialisable)._vptr_Serialisable[8])();
        ByteString::size((ByteString *)0x139069);
        ByteString::resize((ByteString *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8
                          );
        sVar4 = ByteString::size((ByteString *)0x139097);
        puVar5 = ByteString::const_byte_str(in_stack_fffffffffffffde8);
        puVar6 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffdf0,
                            (size_t)in_stack_fffffffffffffde8);
        pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey(in_stack_fffffffffffffdf0);
        iVar3 = RSA_public_decrypt((int)sVar4,puVar5,puVar6,pRVar7,3);
        if (iVar3 < 0) {
          local_c9 = false;
          uVar8 = ERR_get_error();
          softHSMLog(3,"verifyFinal",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x49b,"RSA public decrypt failed (0x%08X)",uVar8);
        }
        else {
          ByteString::resize((ByteString *)in_stack_fffffffffffffdf0,
                             (size_t)in_stack_fffffffffffffde8);
          pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey(in_stack_fffffffffffffdf0);
          puVar5 = ByteString::operator[]
                             ((ByteString *)in_stack_fffffffffffffdf0,
                              (size_t)in_stack_fffffffffffffde8);
          puVar6 = ByteString::operator[]
                             ((ByteString *)in_stack_fffffffffffffdf0,
                              (size_t)in_stack_fffffffffffffde8);
          iVar3 = RSA_verify_PKCS1_PSS
                            (pRVar7,puVar5,local_c8,puVar6,*(int *)&in_RDI[1].currentPrivateKey);
          if (iVar3 != 1) {
            uVar8 = ERR_get_error();
            softHSMLog(3,"verifyFinal",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x4a9,"RSA PSS verify failed (0x%08X)",uVar8);
          }
          local_c9 = iVar3 == 1;
        }
        ByteString::~ByteString((ByteString *)0x1392ba);
      }
      else {
        puVar5 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffdf0,
                            (size_t)in_stack_fffffffffffffde8);
        sVar4 = ByteString::size((ByteString *)0x1392ef);
        m_length = (uint)sVar4;
        puVar6 = ByteString::const_byte_str(in_stack_fffffffffffffde8);
        sVar4 = ByteString::size((ByteString *)0x139320);
        pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey(in_stack_fffffffffffffdf0);
        iVar3 = RSA_verify(local_bc,puVar5,m_length,puVar6,(uint)sVar4,pRVar7);
        local_c9 = iVar3 == 1;
        if (!local_c9) {
          uVar8 = ERR_get_error();
          softHSMLog(3,"verifyFinal",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x4b1,"RSA verify failed (0x%08X)",uVar8);
        }
      }
      local_1 = local_c9;
      ByteString::~ByteString((ByteString *)0x1393ed);
    }
    ByteString::~ByteString((ByteString *)0x13940b);
    ByteString::~ByteString((ByteString *)0x139418);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLRSA::verifyFinal(const ByteString& signature)
{
	// Save necessary state before calling super class verifyFinal
	OSSLRSAPublicKey* pk = (OSSLRSAPublicKey*) currentPublicKey;
	AsymMech::Type mechanism = currentMechanism;

	if (!AsymmetricAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString firstHash, secondHash;

	bool bFirstResult = pCurrentHash->hashFinal(firstHash);
	bool bSecondResult = (pSecondHash != NULL) ? pSecondHash->hashFinal(secondHash) : true;

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (pSecondHash != NULL)
	{
		delete pSecondHash;

		pSecondHash = NULL;
	}

	if (!bFirstResult || !bSecondResult)
	{
		return false;
	}

	ByteString digest = firstHash + secondHash;

	// Determine the signature NID type
	int type = 0;
	bool isPSS = false;
	const EVP_MD* hash = NULL;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			type = NID_md5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			type = NID_sha1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			type = NID_sha224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			type = NID_sha256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			type = NID_sha384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			type = NID_sha512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha1();
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha224();
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha256();
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha384();
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha512();
			break;
		case AsymMech::RSA_SSL:
			type = NID_md5_sha1;
			break;
		default:
			break;
	}

	// Perform the verify operation
	bool rv;

	if (isPSS)
	{
		ByteString plain;
		plain.resize(pk->getN().size());
		int result = RSA_public_decrypt(signature.size(),
						(unsigned char*) signature.const_byte_str(),
						&plain[0],
						pk->getOSSLKey(),
						RSA_NO_PADDING);
		if (result < 0)
		{
			rv = false;
			ERROR_MSG("RSA public decrypt failed (0x%08X)", ERR_get_error());
		}
		else
		{
			plain.resize(result);
			result = RSA_verify_PKCS1_PSS(pk->getOSSLKey(), &digest[0],
						      hash, &plain[0], sLen);
			if (result == 1)
			{
				rv = true;
			}
			else
			{
				rv = false;
				ERROR_MSG("RSA PSS verify failed (0x%08X)", ERR_get_error());
			}
		}
	}
	else
	{
		rv = (RSA_verify(type, &digest[0], digest.size(), (unsigned char*) signature.const_byte_str(), signature.size(), pk->getOSSLKey()) == 1);

		if (!rv) ERROR_MSG("RSA verify failed (0x%08X)", ERR_get_error());
	}

	return rv;
}